

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_d3d56.cc
# Opt level: O3

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::D3D6::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,D3D6 *this)

{
  mt19937 *this_00;
  TestOptions *opt;
  uint32_t uVar1;
  SingleMthdTest *this_01;
  result_type rVar2;
  Test *pTVar3;
  MthdDmaGrobj *pMVar4;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  allocator_type local_649;
  Test *local_648;
  Test *local_640;
  Test *local_638;
  Test *local_630;
  Test *local_628;
  Test *local_620;
  Test *local_618;
  Test *local_610;
  Test *local_608;
  Test *local_600;
  MthdDmaGrobj *local_5f8;
  Test *local_5f0;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *local_5e8;
  undefined1 *local_5e0;
  long local_5d8;
  undefined1 local_5d0 [16];
  undefined1 *local_5c0;
  long local_5b8;
  undefined1 local_5b0 [16];
  undefined1 *local_5a0;
  long local_598;
  undefined1 local_590 [16];
  undefined1 *local_580;
  long local_578;
  undefined1 local_570 [16];
  undefined1 *local_560;
  long local_558;
  undefined1 local_550 [16];
  undefined1 *local_540;
  long local_538;
  undefined1 local_530 [16];
  string local_520;
  string local_500;
  Test *local_4e0;
  Test *local_4d8;
  Test *local_4d0;
  Test *local_4c8;
  Test *local_4c0;
  Test *local_4b8;
  Test *local_4b0;
  Test *local_4a8;
  Test *local_4a0;
  Test *local_498;
  Test *local_490;
  Test *local_488;
  Test *local_480;
  Test *local_478;
  MthdDmaGrobj *local_470;
  Test *local_468;
  SingleMthdTest *local_460;
  undefined1 *local_458;
  long local_450;
  undefined1 local_448 [16];
  undefined1 *local_438;
  long local_430;
  undefined1 local_428 [16];
  undefined1 *local_418;
  long local_410;
  undefined1 local_408 [16];
  undefined1 *local_3f8;
  long local_3f0;
  undefined1 local_3e8 [16];
  undefined1 *local_3d8;
  long local_3d0;
  undefined1 local_3c8 [16];
  undefined1 *local_3b8;
  long local_3b0;
  undefined1 local_3a8 [16];
  undefined1 *local_398;
  long local_390;
  undefined1 local_388 [16];
  undefined1 *local_378;
  long local_370;
  undefined1 local_368 [16];
  undefined1 *local_358;
  long local_350;
  undefined1 local_348 [16];
  undefined1 *local_338;
  long local_330;
  undefined1 local_328 [16];
  undefined1 *local_318;
  long local_310;
  undefined1 local_308 [16];
  undefined1 *local_2f8;
  long local_2f0;
  undefined1 local_2e8 [16];
  undefined1 *local_2d8;
  long local_2d0;
  undefined1 local_2c8 [16];
  undefined1 *local_2b8;
  long local_2b0;
  undefined1 local_2a8 [16];
  undefined1 *local_298;
  long local_290;
  undefined1 local_288 [16];
  undefined1 *local_278;
  long local_270;
  undefined1 local_268 [16];
  undefined1 *local_258;
  long local_250;
  undefined1 local_248 [16];
  undefined1 *local_238;
  long local_230;
  undefined1 local_228 [16];
  undefined1 *local_218;
  long local_210;
  undefined1 local_208 [16];
  undefined1 *local_1f8;
  long local_1f0;
  undefined1 local_1e8 [16];
  undefined1 *local_1d8;
  long local_1d0;
  undefined1 local_1c8 [16];
  undefined1 *local_1b8;
  long local_1b0;
  undefined1 local_1a8 [16];
  undefined1 *local_198;
  long local_190;
  undefined1 local_188 [16];
  undefined1 *local_178;
  long local_170;
  undefined1 local_168 [16];
  undefined1 *local_158;
  long local_150;
  undefined1 local_148 [16];
  SingleMthdTest *local_138;
  Test *local_130;
  Test *local_128;
  MthdDmaGrobj *local_120;
  MthdDmaGrobj *local_118;
  Test *local_110;
  Test *local_108;
  Test *local_100;
  Test *local_f8;
  Test *local_f0;
  Test *local_e8;
  Test *local_e0;
  Test *local_d8;
  Test *local_d0;
  Test *local_c8;
  Test *local_c0;
  Test *local_b8;
  Test *local_b0;
  Test *local_a8;
  Test *local_a0;
  Test *local_98;
  Test *local_90;
  Test *local_88;
  Test *local_80;
  Test *local_78;
  Test *local_70;
  Test *local_68;
  Test *local_60;
  Test *local_58;
  Test *local_50;
  Test *local_48;
  Test *local_40;
  Test *local_38;
  
  local_5e8 = __return_storage_ptr__;
  this_01 = (SingleMthdTest *)operator_new(0x25950);
  this_00 = &(this->super_Class).rnd;
  local_460 = this_01;
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_540 = local_530;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_540,"nop","");
  opt = &(this->super_Class).opt;
  uVar1 = (this->super_Class).cls;
  Test::Test((Test *)this_01,opt,(uint32_t)rVar2);
  (this_01->super_MthdTest).trapbit = -1;
  (this_01->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_00356770;
  this_01->s_cls = uVar1;
  this_01->s_mthd = 0x100;
  this_01->s_stride = 4;
  this_01->s_num = 1;
  this_01->s_trapbit = -1;
  (this_01->name)._M_dataplus._M_p = (pointer)&(this_01->name).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this_01->name,local_540,local_540 + local_538);
  (this_01->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_00356aa0;
  local_138 = this_01;
  pTVar3 = (Test *)operator_new(0x25950);
  local_468 = pTVar3;
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_560 = local_550;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_560,"notify","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar3,opt,(uint32_t)rVar2);
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar3[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x894) = 0x104;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar3[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar3[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar3[0x1e].rnd._M_x + 0x115),local_560,local_560 + local_558);
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356c90;
  local_130 = pTVar3;
  local_5f0 = (Test *)operator_new(0x25950);
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_5a0 = local_590;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a0,"dma_notify","");
  pTVar3 = local_5f0;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_5f0,opt,(uint32_t)rVar2);
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar3[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x894) = 0x180;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar3[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar3[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar3[0x1e].rnd._M_x + 0x115),local_5a0,local_5a0 + local_598);
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00357928;
  local_128 = pTVar3;
  pMVar4 = (MthdDmaGrobj *)operator_new(0x25960);
  local_470 = pMVar4;
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"dma_tex_a","");
  MthdDmaGrobj::MthdDmaGrobj
            (pMVar4,opt,(uint32_t)rVar2,&local_500,-1,(this->super_Class).cls,0x184,0,4);
  local_120 = pMVar4;
  local_5f8 = (MthdDmaGrobj *)operator_new(0x25960);
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_520,"dma_tex_b","");
  pMVar4 = local_5f8;
  MthdDmaGrobj::MthdDmaGrobj
            (local_5f8,opt,(uint32_t)rVar2,&local_520,-1,(this->super_Class).cls,0x188,1,4);
  local_118 = pMVar4;
  pTVar3 = (Test *)operator_new(0x25958);
  local_478 = pTVar3;
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_5c0 = local_5b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c0,"ctx_surf3d","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar3,opt,(uint32_t)rVar2);
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar3[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x894) = 0x18c;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar3[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar3[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar3[0x1e].rnd._M_x + 0x115),local_5c0,local_5c0 + local_5b8);
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00357640;
  *(undefined1 *)(pTVar3[0x1e].rnd._M_x + 0x119) = 0;
  local_110 = pTVar3;
  local_600 = (Test *)operator_new(0x25958);
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_5e0 = local_5d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e0,"tex_0_offset","");
  pTVar3 = local_600;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_600,opt,(uint32_t)rVar2);
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar3[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x894) = 0x308;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar3[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar3[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar3[0x1e].rnd._M_x + 0x115),local_5e0,local_5e0 + local_5d8);
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035e4e8;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x119) = 1;
  local_108 = pTVar3;
  pTVar3 = (Test *)operator_new(0x25958);
  local_480 = pTVar3;
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_158 = local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"tex_1_offset","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar3,opt,(uint32_t)rVar2);
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar3[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x894) = 0x30c;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar3[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar3[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar3[0x1e].rnd._M_x + 0x115),local_158,local_158 + local_150);
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035e4e8;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x119) = 2;
  local_100 = pTVar3;
  pTVar3 = (Test *)operator_new(0x25958);
  local_488 = pTVar3;
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_178 = local_168;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"tex_0_format","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar3,opt,(uint32_t)rVar2);
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar3[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x894) = 0x310;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar3[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar3[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar3[0x1e].rnd._M_x + 0x115),local_178,local_178 + local_170);
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035f278;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x119) = 1;
  local_f8 = pTVar3;
  local_608 = (Test *)operator_new(0x25958);
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_198 = local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"tex_1_format","");
  pTVar3 = local_608;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_608,opt,(uint32_t)rVar2);
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar3[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x894) = 0x314;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar3[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar3[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar3[0x1e].rnd._M_x + 0x115),local_198,local_198 + local_190);
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035f278;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x119) = 2;
  local_f0 = pTVar3;
  pTVar3 = (Test *)operator_new(0x25958);
  local_490 = pTVar3;
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1b8 = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"tex_0_filter","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar3,opt,(uint32_t)rVar2);
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar3[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x894) = 0x318;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar3[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar3[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar3[0x1e].rnd._M_x + 0x115),local_1b8,local_1b8 + local_1b0);
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035f370;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x119) = 1;
  local_e8 = pTVar3;
  local_610 = (Test *)operator_new(0x25958);
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1d8 = local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"tex_1_filter","");
  pTVar3 = local_610;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_610,opt,(uint32_t)rVar2);
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar3[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x894) = 0x31c;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar3[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar3[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar3[0x1e].rnd._M_x + 0x115),local_1d8,local_1d8 + local_1d0);
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035f370;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x119) = 2;
  local_e0 = pTVar3;
  pTVar3 = (Test *)operator_new(0x25958);
  local_498 = pTVar3;
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1f8 = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"combine_0_control_alpha","")
  ;
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar3,opt,(uint32_t)rVar2);
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar3[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x894) = 800;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar3[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar3[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar3[0x1e].rnd._M_x + 0x115),local_1f8,local_1f8 + local_1f0);
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035f750;
  pTVar3[0x1e].rnd._M_x[0x119] = 0;
  local_d8 = pTVar3;
  local_618 = (Test *)operator_new(0x25958);
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_218 = local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"combine_0_control_color","")
  ;
  pTVar3 = local_618;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_618,opt,(uint32_t)rVar2);
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar3[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x894) = 0x324;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar3[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar3[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar3[0x1e].rnd._M_x + 0x115),local_218,local_218 + local_210);
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035f750;
  pTVar3[0x1e].rnd._M_x[0x119] = 0x100000000;
  local_d0 = pTVar3;
  pTVar3 = (Test *)operator_new(0x25958);
  local_4a0 = pTVar3;
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_238 = local_228;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"combine_1_control_alpha","")
  ;
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar3,opt,(uint32_t)rVar2);
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar3[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x894) = 0x32c;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar3[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar3[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar3[0x1e].rnd._M_x + 0x115),local_238,local_238 + local_230);
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035f750;
  pTVar3[0x1e].rnd._M_x[0x119] = 1;
  local_c8 = pTVar3;
  pTVar3 = (Test *)operator_new(0x25958);
  local_4a8 = pTVar3;
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_258 = local_248;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"combine_1_control_color","")
  ;
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar3,opt,(uint32_t)rVar2);
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar3[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x894) = 0x330;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar3[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar3[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar3[0x1e].rnd._M_x + 0x115),local_258,local_258 + local_250);
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035f750;
  pTVar3[0x1e].rnd._M_x[0x119] = 0x100000001;
  local_c0 = pTVar3;
  pTVar3 = (Test *)operator_new(0x25950);
  local_4b0 = pTVar3;
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_278 = local_268;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"combine_factor","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar3,opt,(uint32_t)rVar2);
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar3[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x894) = 0x334;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar3[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar3[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar3[0x1e].rnd._M_x + 0x115),local_278,local_278 + local_270);
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035f848;
  local_b8 = pTVar3;
  local_620 = (Test *)operator_new(0x25950);
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_298 = local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"blend","");
  pTVar3 = local_620;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_620,opt,(uint32_t)rVar2);
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar3[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x894) = 0x338;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar3[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar3[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar3[0x1e].rnd._M_x + 0x115),local_298,local_298 + local_290);
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035f468;
  local_b0 = pTVar3;
  pTVar3 = (Test *)operator_new(0x25950);
  local_4b8 = pTVar3;
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_2b8 = local_2a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"config","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar3,opt,(uint32_t)rVar2);
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar3[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x894) = 0x33c;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar3[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar3[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar3[0x1e].rnd._M_x + 0x115),local_2b8,local_2b8 + local_2b0);
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035f560;
  local_a8 = pTVar3;
  local_628 = (Test *)operator_new(0x25950);
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_2d8 = local_2c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"stencil_func","");
  pTVar3 = local_628;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_628,opt,(uint32_t)rVar2);
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar3[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x894) = 0x340;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar3[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar3[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar3[0x1e].rnd._M_x + 0x115),local_2d8,local_2d8 + local_2d0);
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035f940;
  local_a0 = pTVar3;
  pTVar3 = (Test *)operator_new(0x25950);
  local_4c0 = pTVar3;
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_2f8 = local_2e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"stencil_op","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar3,opt,(uint32_t)rVar2);
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar3[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x894) = 0x344;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar3[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar3[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar3[0x1e].rnd._M_x + 0x115),local_2f8,local_2f8 + local_2f0);
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035fa38;
  local_98 = pTVar3;
  local_630 = (Test *)operator_new(0x25950);
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_318 = local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"fog_color","");
  pTVar3 = local_630;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_630,opt,(uint32_t)rVar2);
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar3[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x894) = 0x348;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar3[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar3[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar3[0x1e].rnd._M_x + 0x115),local_318,local_318 + local_310);
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035e7d0;
  local_90 = pTVar3;
  pTVar3 = (Test *)operator_new(0x25950);
  local_4c8 = pTVar3;
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_338 = local_328;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"tlv_x","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar3,opt,(uint32_t)rVar2);
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar3[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x894) = 0x400;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x113) = 0x28;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x89c) = 8;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar3[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar3[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar3[0x1e].rnd._M_x + 0x115),local_338,local_338 + local_330);
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035eca8;
  local_88 = pTVar3;
  local_638 = (Test *)operator_new(0x25950);
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_358 = local_348;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"tlv_y","");
  pTVar3 = local_638;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_638,opt,(uint32_t)rVar2);
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar3[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x894) = 0x404;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x113) = 0x28;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x89c) = 8;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar3[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar3[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar3[0x1e].rnd._M_x + 0x115),local_358,local_358 + local_350);
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035eda0;
  local_80 = pTVar3;
  pTVar3 = (Test *)operator_new(0x25950);
  local_4d0 = pTVar3;
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_378 = local_368;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"tlv_z","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar3,opt,(uint32_t)rVar2);
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar3[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x894) = 0x408;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x113) = 0x28;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x89c) = 8;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar3[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar3[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar3[0x1e].rnd._M_x + 0x115),local_378,local_378 + local_370);
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035ee98;
  local_78 = pTVar3;
  local_640 = (Test *)operator_new(0x25950);
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_398 = local_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"tlv_rhw","");
  pTVar3 = local_640;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_640,opt,(uint32_t)rVar2);
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar3[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x894) = 0x40c;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x113) = 0x28;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x89c) = 8;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar3[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar3[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar3[0x1e].rnd._M_x + 0x115),local_398,local_398 + local_390);
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035ef90;
  local_70 = pTVar3;
  pTVar3 = (Test *)operator_new(0x25950);
  local_4d8 = pTVar3;
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_3b8 = local_3a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"tlv_color","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar3,opt,(uint32_t)rVar2);
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar3[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x894) = 0x410;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x113) = 0x28;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x89c) = 8;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar3[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar3[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar3[0x1e].rnd._M_x + 0x115),local_3b8,local_3b8 + local_3b0);
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035ebb0;
  local_68 = pTVar3;
  local_648 = (Test *)operator_new(0x25950);
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"tlv_fog_col1","");
  pTVar3 = local_648;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_648,opt,(uint32_t)rVar2);
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar3[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x894) = 0x414;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x113) = 0x28;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x89c) = 8;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar3[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar3[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar3[0x1e].rnd._M_x + 0x115),local_3d8,local_3d8 + local_3d0);
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035f658;
  local_60 = pTVar3;
  pTVar3 = (Test *)operator_new(0x25960);
  local_4e0 = pTVar3;
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_3f8 = local_3e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"tlv_u_0","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar3,opt,(uint32_t)rVar2);
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar3[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x894) = 0x418;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x113) = 0x28;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x89c) = 8;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar3[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar3[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar3[0x1e].rnd._M_x + 0x115),local_3f8,local_3f8 + local_3f0);
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035f088;
  pTVar3[0x1e].rnd._M_x[0x119] = 0;
  *(undefined1 *)(pTVar3[0x1e].rnd._M_x + 0x11a) = 0;
  local_58 = pTVar3;
  pTVar3 = (Test *)operator_new(0x25960);
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_418 = local_408;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"tlv_v_0","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar3,opt,(uint32_t)rVar2);
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar3[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x894) = 0x41c;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x113) = 0x28;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x89c) = 8;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar3[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar3[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar3[0x1e].rnd._M_x + 0x115),local_418,local_418 + local_410);
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035f088;
  pTVar3[0x1e].rnd._M_x[0x119] = 1;
  *(undefined1 *)(pTVar3[0x1e].rnd._M_x + 0x11a) = 0;
  local_50 = pTVar3;
  pTVar3 = (Test *)operator_new(0x25960);
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_438 = local_428;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"tlv_u_1","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar3,opt,(uint32_t)rVar2);
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar3[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x894) = 0x420;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x113) = 0x28;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x89c) = 8;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar3[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar3[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar3[0x1e].rnd._M_x + 0x115),local_438,local_438 + local_430);
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035f088;
  pTVar3[0x1e].rnd._M_x[0x119] = 0x100000000;
  *(undefined1 *)(pTVar3[0x1e].rnd._M_x + 0x11a) = 0;
  local_48 = pTVar3;
  pTVar3 = (Test *)operator_new(0x25960);
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_458 = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"tlv_v_1","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar3,opt,(uint32_t)rVar2);
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar3[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x894) = 0x424;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x113) = 0x28;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x89c) = 8;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar3[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar3[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar3[0x1e].rnd._M_x + 0x115),local_458,local_458 + local_450);
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035f088;
  pTVar3[0x1e].rnd._M_x[0x119] = 0x100000001;
  *(undefined1 *)(pTVar3[0x1e].rnd._M_x + 0x11a) = 1;
  local_40 = pTVar3;
  pTVar3 = (Test *)operator_new(0x25950);
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_580 = local_570;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_580,"draw","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar3,opt,(uint32_t)rVar2);
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar3[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x894) = 0x540;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar3[0x1e].rnd._M_x + 0x89c) = 0x30;
  *(undefined4 *)(pTVar3[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar3[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar3[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar3[0x1e].rnd._M_x + 0x115),local_580,local_580 + local_578);
  pTVar3->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035b0e8;
  __l._M_len = 0x21;
  __l._M_array = &local_138;
  local_38 = pTVar3;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector(local_5e8,__l,&local_649);
  if (local_580 != local_570) {
    operator_delete(local_580);
  }
  if (local_458 != local_448) {
    operator_delete(local_458);
  }
  if (local_438 != local_428) {
    operator_delete(local_438);
  }
  if (local_418 != local_408) {
    operator_delete(local_418);
  }
  if (local_3f8 != local_3e8) {
    operator_delete(local_3f8);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8);
  }
  if (local_3b8 != local_3a8) {
    operator_delete(local_3b8);
  }
  if (local_398 != local_388) {
    operator_delete(local_398);
  }
  if (local_378 != local_368) {
    operator_delete(local_378);
  }
  if (local_358 != local_348) {
    operator_delete(local_358);
  }
  if (local_338 != local_328) {
    operator_delete(local_338);
  }
  if (local_318 != local_308) {
    operator_delete(local_318);
  }
  if (local_2f8 != local_2e8) {
    operator_delete(local_2f8);
  }
  if (local_2d8 != local_2c8) {
    operator_delete(local_2d8);
  }
  if (local_2b8 != local_2a8) {
    operator_delete(local_2b8);
  }
  if (local_298 != local_288) {
    operator_delete(local_298);
  }
  if (local_278 != local_268) {
    operator_delete(local_278);
  }
  if (local_258 != local_248) {
    operator_delete(local_258);
  }
  if (local_238 != local_228) {
    operator_delete(local_238);
  }
  if (local_218 != local_208) {
    operator_delete(local_218);
  }
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8);
  }
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8);
  }
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8);
  }
  if (local_198 != local_188) {
    operator_delete(local_198);
  }
  if (local_178 != local_168) {
    operator_delete(local_178);
  }
  if (local_158 != local_148) {
    operator_delete(local_158);
  }
  if (local_5e0 != local_5d0) {
    operator_delete(local_5e0);
  }
  if (local_5c0 != local_5b0) {
    operator_delete(local_5c0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != &local_520.field_2) {
    operator_delete(local_520._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != &local_500.field_2) {
    operator_delete(local_500._M_dataplus._M_p);
  }
  if (local_5a0 != local_590) {
    operator_delete(local_5a0);
  }
  if (local_560 != local_550) {
    operator_delete(local_560);
  }
  if (local_540 != local_530) {
    operator_delete(local_540);
  }
  return local_5e8;
}

Assistant:

std::vector<SingleMthdTest *> D3D6::mthds() {
	return {
		new MthdNop(opt, rnd(), "nop", -1, cls, 0x100),
		new MthdNotify(opt, rnd(), "notify", -1, cls, 0x104),
		new MthdDmaNotify(opt, rnd(), "dma_notify", -1, cls, 0x180),
		new MthdDmaGrobj(opt, rnd(), "dma_tex_a", -1, cls, 0x184, 0, DMA_R | DMA_ALIGN),
		new MthdDmaGrobj(opt, rnd(), "dma_tex_b", -1, cls, 0x188, 1, DMA_R | DMA_ALIGN),
		new MthdCtxSurf3D(opt, rnd(), "ctx_surf3d", -1, cls, 0x18c, SURF2D_NV4),
		new MthdD3D56TexOffset(opt, rnd(), "tex_0_offset", -1, cls, 0x308, 1),
		new MthdD3D56TexOffset(opt, rnd(), "tex_1_offset", -1, cls, 0x30c, 2),
		new MthdD3D56TexFormat(opt, rnd(), "tex_0_format", -1, cls, 0x310, 1),
		new MthdD3D56TexFormat(opt, rnd(), "tex_1_format", -1, cls, 0x314, 2),
		new MthdD3D56TexFilter(opt, rnd(), "tex_0_filter", -1, cls, 0x318, 1),
		new MthdD3D56TexFilter(opt, rnd(), "tex_1_filter", -1, cls, 0x31c, 2),
		new MthdD3D6CombineControl(opt, rnd(), "combine_0_control_alpha", -1, cls, 0x320, 0, 0),
		new MthdD3D6CombineControl(opt, rnd(), "combine_0_control_color", -1, cls, 0x324, 0, 1),
		new MthdD3D6CombineControl(opt, rnd(), "combine_1_control_alpha", -1, cls, 0x32c, 1, 0),
		new MthdD3D6CombineControl(opt, rnd(), "combine_1_control_color", -1, cls, 0x330, 1, 1),
		new MthdD3D6CombineFactor(opt, rnd(), "combine_factor", -1, cls, 0x334),
		new MthdD3D56Blend(opt, rnd(), "blend", -1, cls, 0x338),
		new MthdD3D56Config(opt, rnd(), "config", -1, cls, 0x33c),
		new MthdD3D6StencilFunc(opt, rnd(), "stencil_func", -1, cls, 0x340),
		new MthdD3D6StencilOp(opt, rnd(), "stencil_op", -1, cls, 0x344),
		new MthdD3D56FogColor(opt, rnd(), "fog_color", -1, cls, 0x348),
		new MthdD3D56TlvX(opt, rnd(), "tlv_x", -1, cls, 0x400, 8, 0x28),
		new MthdD3D56TlvY(opt, rnd(), "tlv_y", -1, cls, 0x404, 8, 0x28),
		new MthdD3D56TlvZ(opt, rnd(), "tlv_z", -1, cls, 0x408, 8, 0x28),
		new MthdD3D56TlvRhw(opt, rnd(), "tlv_rhw", -1, cls, 0x40c, 8, 0x28),
		new MthdD3D56TlvColor(opt, rnd(), "tlv_color", -1, cls, 0x410, 8, 0x28),
		new MthdD3D56TlvFogCol1(opt, rnd(), "tlv_fog_col1", -1, cls, 0x414, 8, 0x28),
		new MthdD3D56TlvUv(opt, rnd(), "tlv_u_0", -1, cls, 0x418, 8, 0x28, 0, 0, false),
		new MthdD3D56TlvUv(opt, rnd(), "tlv_v_0", -1, cls, 0x41c, 8, 0x28, 0, 1, false),
		new MthdD3D56TlvUv(opt, rnd(), "tlv_u_1", -1, cls, 0x420, 8, 0x28, 1, 0, false),
		new MthdD3D56TlvUv(opt, rnd(), "tlv_v_1", -1, cls, 0x424, 8, 0x28, 1, 1, true),
		new UntestedMthd(opt, rnd(), "draw", -1, cls, 0x540, 0x30),
	};
}